

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unique_ptr<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>_>_>
 spdlog::details::
 make_unique<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>,spdlog::details::padding_info&>
           (padding_info *args)

{
  padding_info padinfo;
  z_formatter<spdlog::details::null_scoped_padder> *in_RSI;
  _Head_base<0UL,_spdlog::details::z_formatter<spdlog::details::null_scoped_padder>_*,_false> in_RDI
  ;
  undefined8 unaff_retaddr;
  pointer in_stack_ffffffffffffffa8;
  _Head_base<0UL,_spdlog::details::z_formatter<spdlog::details::null_scoped_padder>_*,_false> this;
  _Head_base<0UL,_spdlog::details::z_formatter<spdlog::details::null_scoped_padder>_*,_false> _Var1;
  
  this._M_head_impl = in_RDI._M_head_impl;
  _Var1._M_head_impl = in_RDI._M_head_impl;
  operator_new(0x28);
  padinfo._8_8_ = unaff_retaddr;
  padinfo.width_ = (size_t)_Var1._M_head_impl;
  z_formatter<spdlog::details::null_scoped_padder>::z_formatter(in_RSI,padinfo);
  std::
  unique_ptr<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>,std::default_delete<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>>>
  ::
  unique_ptr<std::default_delete<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>>,void>
            ((unique_ptr<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>_>_>
              *)this._M_head_impl,in_stack_ffffffffffffffa8);
  return (__uniq_ptr_data<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>_>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::null_scoped_padder>_>,_true,_true>
            )in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args) {
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}